

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftplistparser.c
# Opt level: O3

CURLcode ftp_pl_insert_finfo(connectdata *conn,curl_fileinfo *finfo)

{
  curl_llist *list;
  long *plVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  code *pcVar6;
  CURLcode CVar7;
  
  list = *(curl_llist **)(conn[0x16].syserr_buf + 0xb0);
  plVar1 = *(long **)(conn[0x16].syserr_buf + 0xb8);
  lVar2 = *plVar1;
  pcVar4 = finfo->b_data;
  finfo->filename = pcVar4 + *(long *)(lVar2 + 0x28);
  pcVar5 = pcVar4 + *(long *)(lVar2 + 0x38);
  if (*(long *)(lVar2 + 0x38) == 0) {
    pcVar5 = (char *)0x0;
  }
  (finfo->strings).group = pcVar5;
  pcVar5 = pcVar4 + *(long *)(lVar2 + 0x48);
  if (*(long *)(lVar2 + 0x48) == 0) {
    pcVar5 = (char *)0x0;
  }
  (finfo->strings).perm = pcVar5;
  pcVar5 = pcVar4 + *(long *)(lVar2 + 0x50);
  if (*(long *)(lVar2 + 0x50) == 0) {
    pcVar5 = (char *)0x0;
  }
  (finfo->strings).target = pcVar5;
  (finfo->strings).time = pcVar4 + *(long *)(lVar2 + 0x40);
  pcVar4 = pcVar4 + *(long *)(lVar2 + 0x30);
  if (*(long *)(lVar2 + 0x30) == 0) {
    pcVar4 = (char *)0x0;
  }
  (finfo->strings).user = pcVar4;
  pcVar6 = (code *)conn[1].connection_id;
  if (pcVar6 == (code *)0x0) {
    pcVar6 = Curl_fnmatch;
  }
  iVar3 = (*pcVar6)(conn[1].dns_entry,*(undefined8 *)(conn[0x16].syserr_buf + 0xa8));
  CVar7 = CURLE_OK;
  if (iVar3 == 0) {
    if ((finfo->filetype == CURLFILETYPE_SYMLINK) &&
       (pcVar5 = (finfo->strings).target, pcVar5 != (char *)0x0)) {
      pcVar5 = strstr(pcVar5," -> ");
      CVar7 = CURLE_OK;
      if (pcVar5 != (char *)0x0) goto LAB_001351ac;
    }
    iVar3 = Curl_llist_insert_next(list,list->tail,finfo);
    CVar7 = CURLE_OK;
    if (iVar3 != 0) goto LAB_001351b6;
    CVar7 = CURLE_OUT_OF_MEMORY;
  }
LAB_001351ac:
  Curl_fileinfo_dtor((void *)0x0,finfo);
LAB_001351b6:
  *(undefined8 *)(*plVar1 + 0x10) = 0;
  return CVar7;
}

Assistant:

static CURLcode ftp_pl_insert_finfo(struct connectdata *conn,
                                    struct curl_fileinfo *finfo)
{
  curl_fnmatch_callback compare;
  struct WildcardData *wc = &conn->data->wildcard;
  struct ftp_wc_tmpdata *tmpdata = wc->tmp;
  struct curl_llist *llist = wc->filelist;
  struct ftp_parselist_data *parser = tmpdata->parser;
  bool add = TRUE;

  /* move finfo pointers to b_data */
  char *str = finfo->b_data;
  finfo->filename       = str + parser->offsets.filename;
  finfo->strings.group  = parser->offsets.group ?
                          str + parser->offsets.group : NULL;
  finfo->strings.perm   = parser->offsets.perm ?
                          str + parser->offsets.perm : NULL;
  finfo->strings.target = parser->offsets.symlink_target ?
                          str + parser->offsets.symlink_target : NULL;
  finfo->strings.time   = str + parser->offsets.time;
  finfo->strings.user   = parser->offsets.user ?
                          str + parser->offsets.user : NULL;

  /* get correct fnmatch callback */
  compare = conn->data->set.fnmatch;
  if(!compare)
    compare = Curl_fnmatch;

  /* filter pattern-corresponding filenames */
  if(compare(conn->data->set.fnmatch_data, wc->pattern,
             finfo->filename) == 0) {
    /* discard symlink which is containing multiple " -> " */
    if((finfo->filetype == CURLFILETYPE_SYMLINK) && finfo->strings.target &&
       (strstr(finfo->strings.target, " -> "))) {
      add = FALSE;
    }
  }
  else {
    add = FALSE;
  }

  if(add) {
    if(!Curl_llist_insert_next(llist, llist->tail, finfo)) {
      Curl_fileinfo_dtor(NULL, finfo);
      tmpdata->parser->file_data = NULL;
      return CURLE_OUT_OF_MEMORY;
    }
  }
  else {
    Curl_fileinfo_dtor(NULL, finfo);
  }

  tmpdata->parser->file_data = NULL;
  return CURLE_OK;
}